

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval.h
# Opt level: O2

void __thiscall
embree::avx::FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          CatmullClarkPatch *patch,Vec2f *uv,float dscale,size_t depth,BezierCurve *border0,
          BezierCurve *border1,BezierCurve *border2,BezierCurve *border3)

{
  anon_struct_8_2_947311e6_for_anon_union_8_2_4062524c_for_Vec2<float>_1_0 aVar1;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar2;
  uint uVar3;
  int iVar4;
  vfloat_impl<4> *pvVar5;
  vfloat_impl<4> *pvVar6;
  vfloat_impl<4> *pvVar7;
  vfloat_impl<4> *pvVar8;
  vfloat_impl<4> *pvVar9;
  vfloat_impl<4> *pvVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ssize_t numCreases;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar28 [16];
  float t1;
  float fVar29;
  undefined1 auVar30 [16];
  float t0;
  float fVar31;
  float fVar35;
  float fVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float B0;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar40 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  vfloat_impl<4> f3_p_3;
  float fVar54;
  float fVar55;
  float fVar56;
  vfloat_impl<4> f3_p;
  float fVar57;
  float fVar58;
  float fVar60;
  float fVar61;
  vfloat_impl<4> f3_p_1;
  float fVar62;
  undefined1 auVar59 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  vfloat_impl<4> f3_p_2;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> patches;
  float local_3500;
  float fStack_34fc;
  float fStack_34f8;
  float fStack_34f4;
  undefined8 local_34f0;
  undefined8 uStack_34e8;
  undefined1 local_34e0 [16];
  float fStack_34cc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3480;
  float local_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  float local_3460;
  float fStack_345c;
  float fStack_3458;
  float fStack_3454;
  float local_3450;
  float fStack_344c;
  float fStack_3448;
  float fStack_3444;
  float local_3440;
  float fStack_343c;
  float fStack_3438;
  float fStack_3434;
  float local_3430;
  float fStack_342c;
  float fStack_3428;
  float fStack_3424;
  float local_3420;
  float fStack_341c;
  float fStack_3418;
  float fStack_3414;
  float local_3410;
  float fStack_340c;
  float fStack_3408;
  float fStack_3404;
  float local_3400;
  float fStack_33fc;
  float fStack_33f8;
  float fStack_33f4;
  float local_33f0;
  float fStack_33ec;
  float fStack_33e8;
  float fStack_33e4;
  float local_33e0;
  float fStack_33dc;
  float fStack_33d8;
  float fStack_33d4;
  float local_33d0;
  float fStack_33cc;
  float fStack_33c8;
  float fStack_33c4;
  float local_33c0;
  float fStack_33bc;
  float fStack_33b8;
  float fStack_33b4;
  float local_33b0;
  float fStack_33ac;
  float fStack_33a8;
  float fStack_33a4;
  float local_33a0;
  float fStack_339c;
  float fStack_3398;
  float fStack_3394;
  float local_3390;
  float fStack_338c;
  float fStack_3388;
  float fStack_3384;
  float local_3380;
  float fStack_337c;
  float fStack_3378;
  float fStack_3374;
  float local_3370;
  float fStack_336c;
  float fStack_3368;
  float fStack_3364;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  float local_3350;
  float fStack_334c;
  float fStack_3348;
  float fStack_3344;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
  local_2780;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
  local_1a80;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
  local_d80;
  
  local_34e0._4_4_ = in_XMM0_Db;
  local_34e0._0_4_ = dscale;
  local_34e0._8_4_ = in_XMM0_Dc;
  local_34e0._12_4_ = in_XMM0_Dd;
  local_34f0 = depth;
  do {
    bVar12 = false;
    bVar11 = false;
    uVar3 = (patch->ring).items[0].face_valence;
    uVar23 = 0;
    for (uVar24 = 0; uVar3 != uVar24; uVar24 = uVar24 + 1) {
      uVar23 = uVar23 + (0.0 < (patch->ring).items[0].crease_weight.data[uVar24]);
    }
    iVar4 = (patch->ring).items[0].border_index;
    bVar25 = uVar23 == (uint)(iVar4 != -1) * 2;
    bVar18 = true;
    fVar27 = (patch->ring).items[0].vertex_crease_weight;
    bVar19 = bVar11;
    bVar22 = bVar12;
    if (uVar3 == 2 && iVar4 != -1) {
      if (((fVar27 == 0.0) && (!NAN(fVar27))) || (INFINITY <= fVar27)) goto LAB_00e95991;
    }
    else if ((fVar27 == 0.0) && (!NAN(fVar27))) {
      if (uVar3 != 3 || iVar4 == -1) {
        bVar18 = uVar3 == 4 && iVar4 == -1;
        bVar25 = (uVar3 == 4 && iVar4 == -1) && bVar25;
      }
LAB_00e95991:
      bVar19 = bVar25;
      bVar22 = bVar18;
    }
    uVar3 = (patch->ring).items[1].face_valence;
    uVar23 = 0;
    for (uVar24 = 0; uVar3 != uVar24; uVar24 = uVar24 + 1) {
      uVar23 = uVar23 + (0.0 < (patch->ring).items[1].crease_weight.data[uVar24]);
    }
    iVar4 = (patch->ring).items[1].border_index;
    bVar25 = uVar23 == (uint)(iVar4 != -1) * 2;
    bVar17 = true;
    fVar27 = (patch->ring).items[1].vertex_crease_weight;
    bVar18 = bVar11;
    bVar21 = bVar12;
    if (uVar3 == 2 && iVar4 != -1) {
      if (((fVar27 == 0.0) && (!NAN(fVar27))) || (INFINITY <= fVar27)) goto LAB_00e95a3d;
    }
    else if ((fVar27 == 0.0) && (!NAN(fVar27))) {
      if (uVar3 != 3 || iVar4 == -1) {
        bVar17 = uVar3 == 4 && iVar4 == -1;
        bVar25 = (uVar3 == 4 && iVar4 == -1) && bVar25;
      }
LAB_00e95a3d:
      bVar18 = bVar25;
      bVar21 = bVar17;
    }
    uVar3 = (patch->ring).items[2].face_valence;
    uVar23 = 0;
    for (uVar24 = 0; uVar3 != uVar24; uVar24 = uVar24 + 1) {
      uVar23 = uVar23 + (0.0 < (patch->ring).items[2].crease_weight.data[uVar24]);
    }
    iVar4 = (patch->ring).items[2].border_index;
    bVar25 = uVar23 == (uint)(iVar4 != -1) * 2;
    bVar26 = true;
    fVar27 = (patch->ring).items[2].vertex_crease_weight;
    bVar17 = bVar11;
    bVar20 = bVar12;
    if (uVar3 == 2 && iVar4 != -1) {
      if (((fVar27 == 0.0) && (!NAN(fVar27))) || (INFINITY <= fVar27)) goto LAB_00e95aef;
    }
    else if ((fVar27 == 0.0) && (!NAN(fVar27))) {
      if (uVar3 != 3 || iVar4 == -1) {
        bVar26 = uVar3 == 4 && iVar4 == -1;
        bVar25 = (uVar3 == 4 && iVar4 == -1) && bVar25;
      }
LAB_00e95aef:
      bVar17 = bVar25;
      bVar20 = bVar26;
    }
    uVar3 = (patch->ring).items[3].face_valence;
    uVar23 = 0;
    for (uVar24 = 0; uVar3 != uVar24; uVar24 = uVar24 + 1) {
      uVar23 = uVar23 + (0.0 < (patch->ring).items[3].crease_weight.data[uVar24]);
    }
    iVar4 = (patch->ring).items[3].border_index;
    bVar26 = uVar23 == (uint)(iVar4 != -1) * 2;
    bVar25 = true;
    fVar27 = (patch->ring).items[3].vertex_crease_weight;
    if (uVar3 == 2 && iVar4 != -1) {
      if (((fVar27 == 0.0) && (!NAN(fVar27))) || (INFINITY <= fVar27)) goto LAB_00e95ba5;
    }
    else if ((fVar27 == 0.0) && (!NAN(fVar27))) {
      if (uVar3 != 3 || iVar4 == -1) {
        bVar26 = (uVar3 == 4 && iVar4 == -1) && bVar26;
        bVar25 = uVar3 == 4 && iVar4 == -1;
      }
LAB_00e95ba5:
      bVar12 = bVar25;
      bVar11 = bVar26;
    }
    if (9 < local_34f0) {
      if (!(bool)(bVar21 & bVar22 & bVar20 & bVar12)) {
        GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init_crackfix
                  ((GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                   patch,border0,border1,border2,border3);
        fVar27 = (uv->field_0).field_0.x;
        fVar29 = (uv->field_0).field_0.y;
        pvVar5 = this->P;
        pvVar6 = this->dPdu;
        pvVar7 = this->dPdv;
        pvVar8 = this->ddPdudu;
        pvVar9 = this->ddPdvdv;
        pvVar10 = this->ddPdudv;
        auVar30 = ZEXT416((uint)fVar29);
        auVar28 = ZEXT416((uint)fVar27);
        if (pvVar5 != (vfloat_impl<4> *)0x0) {
          if ((((fVar29 == 1.0) && (!NAN(fVar29))) ||
              (((fVar27 == 0.0 && (!NAN(fVar27))) || ((fVar27 == 1.0 && (!NAN(fVar27))))))) ||
             ((fVar29 == 0.0 && (!NAN(fVar29))))) {
            local_34f0._4_4_ = fStack_342c;
            local_34f0._0_4_ = local_3430;
            uStack_34e8._4_4_ = fStack_3424;
            uStack_34e8._0_4_ = fStack_3428;
            fVar74 = local_3420;
            fVar75 = fStack_341c;
            fVar76 = fStack_3418;
            fVar77 = fStack_3414;
            fVar67 = local_33e0;
            fVar69 = fStack_33dc;
            fVar71 = fStack_33d8;
            fVar73 = fStack_33d4;
            fVar58 = local_33f0;
            fVar60 = fStack_33ec;
            fVar61 = fStack_33e8;
            fVar62 = fStack_33e4;
          }
          else {
            auVar32 = vshufps_avx(auVar28,auVar28,0);
            auVar37 = vshufps_avx(auVar30,auVar30,0);
            fVar74 = fVar27 + fVar29;
            auVar34 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
            auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - fVar74 * auVar34._0_4_)));
            auVar34 = vshufps_avx(auVar34,auVar34,0);
            local_34f0._4_4_ =
                 (auVar32._4_4_ * fStack_342c + auVar37._4_4_ * fStack_337c) * auVar34._4_4_;
            local_34f0._0_4_ =
                 (auVar32._0_4_ * local_3430 + auVar37._0_4_ * local_3380) * auVar34._0_4_;
            uStack_34e8._0_4_ =
                 (auVar32._8_4_ * fStack_3428 + auVar37._8_4_ * fStack_3378) * auVar34._8_4_;
            uStack_34e8._4_4_ =
                 (auVar32._12_4_ * fStack_3424 + auVar37._12_4_ * fStack_3374) * auVar34._12_4_;
            fVar74 = 1.0 - fVar27;
            auVar40 = vshufps_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),0);
            fVar74 = fVar74 + fVar29;
            auVar34 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
            auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - fVar74 * auVar34._0_4_)));
            auVar59 = vshufps_avx(auVar34,auVar34,0);
            auVar14 = vshufps_avx(ZEXT416((uint)(1.0 - fVar29)),ZEXT416((uint)(1.0 - fVar29)),0);
            fVar74 = (2.0 - fVar27) - fVar29;
            auVar34 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
            auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - fVar74 * auVar34._0_4_)));
            auVar33 = vshufps_avx(auVar34,auVar34,0);
            fVar74 = (fVar27 + 1.0) - fVar29;
            auVar34 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
            auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - fVar74 * auVar34._0_4_)));
            auVar34 = vshufps_avx(auVar34,auVar34,0);
            fVar74 = auVar59._0_4_ * (auVar40._0_4_ * local_3370 + auVar37._0_4_ * local_3420);
            fVar75 = auVar59._4_4_ * (auVar40._4_4_ * fStack_336c + auVar37._4_4_ * fStack_341c);
            fVar76 = auVar59._8_4_ * (auVar40._8_4_ * fStack_3368 + auVar37._8_4_ * fStack_3418);
            fVar77 = auVar59._12_4_ * (auVar40._12_4_ * fStack_3364 + auVar37._12_4_ * fStack_3414);
            fVar67 = (auVar40._0_4_ * local_33e0 + auVar14._0_4_ * local_3350) * auVar33._0_4_;
            fVar69 = (auVar40._4_4_ * fStack_33dc + auVar14._4_4_ * fStack_334c) * auVar33._4_4_;
            fVar71 = (auVar40._8_4_ * fStack_33d8 + auVar14._8_4_ * fStack_3348) * auVar33._8_4_;
            fVar73 = (auVar40._12_4_ * fStack_33d4 + auVar14._12_4_ * fStack_3344) * auVar33._12_4_;
            fVar58 = (auVar14._0_4_ * local_33f0 + auVar32._0_4_ * local_3360) * auVar34._0_4_;
            fVar60 = (auVar14._4_4_ * fStack_33ec + auVar32._4_4_ * fStack_335c) * auVar34._4_4_;
            fVar61 = (auVar14._8_4_ * fStack_33e8 + auVar32._8_4_ * fStack_3358) * auVar34._8_4_;
            fVar62 = (auVar14._12_4_ * fStack_33e4 + auVar32._12_4_ * fStack_3354) * auVar34._12_4_;
          }
          fVar13 = 1.0 - fVar29;
          fVar31 = 1.0 - fVar27;
          auVar34 = ZEXT416((uint)(fVar13 * fVar13 * fVar13));
          auVar34 = vshufps_avx(auVar34,auVar34,0);
          auVar32 = ZEXT416((uint)(fVar31 * fVar31 * fVar31));
          auVar32 = vshufps_avx(auVar32,auVar32,0);
          auVar37 = ZEXT416((uint)(fVar27 * fVar27 * 3.0 * fVar31));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          auVar40 = ZEXT416((uint)(fVar27 * fVar27 * fVar27));
          auVar40 = vshufps_avx(auVar40,auVar40,0);
          fVar43 = auVar40._0_4_;
          fVar39 = auVar40._4_4_;
          fVar42 = auVar40._8_4_;
          fVar44 = auVar40._12_4_;
          fVar65 = auVar37._0_4_;
          fVar66 = auVar37._4_4_;
          fVar38 = auVar37._8_4_;
          fVar41 = auVar37._12_4_;
          auVar37 = ZEXT416((uint)(fVar27 * 3.0 * fVar31 * fVar31));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          fVar31 = auVar37._0_4_;
          fVar35 = auVar37._4_4_;
          fVar36 = auVar37._8_4_;
          fVar68 = auVar37._12_4_;
          fVar70 = auVar32._0_4_;
          fVar72 = auVar32._4_4_;
          fVar63 = auVar32._8_4_;
          fVar64 = auVar32._12_4_;
          auVar32 = ZEXT416((uint)(fVar29 * 3.0 * fVar13 * fVar13));
          auVar32 = vshufps_avx(auVar32,auVar32,0);
          auVar37 = ZEXT416((uint)(fVar29 * fVar29 * 3.0 * fVar13));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          auVar40 = ZEXT416((uint)(fVar29 * fVar29 * fVar29));
          auVar40 = vshufps_avx(auVar40,auVar40,0);
          (pvVar5->field_0).v[0] =
               auVar34._0_4_ *
               (fVar70 * local_3480.v[0] +
               fVar31 * local_3470 + fVar43 * local_3450 + fVar65 * local_3460) +
               auVar32._0_4_ *
               (fVar70 * local_3440 +
               fVar31 * (float)local_34f0 + fVar43 * local_3410 + fVar65 * fVar74) +
               auVar37._0_4_ *
               (fVar70 * local_3400 + fVar31 * fVar58 + fVar43 * local_33d0 + fVar65 * fVar67) +
               auVar40._0_4_ *
               (fVar70 * local_33c0 +
               fVar31 * local_33b0 + fVar65 * local_33a0 + fVar43 * local_3390);
          (pvVar5->field_0).v[1] =
               auVar34._4_4_ *
               (fVar72 * local_3480.v[1] +
               fVar35 * fStack_346c + fVar39 * fStack_344c + fVar66 * fStack_345c) +
               auVar32._4_4_ *
               (fVar72 * fStack_343c +
               fVar35 * local_34f0._4_4_ + fVar39 * fStack_340c + fVar66 * fVar75) +
               auVar37._4_4_ *
               (fVar72 * fStack_33fc + fVar35 * fVar60 + fVar39 * fStack_33cc + fVar66 * fVar69) +
               auVar40._4_4_ *
               (fVar72 * fStack_33bc +
               fVar35 * fStack_33ac + fVar66 * fStack_339c + fVar39 * fStack_338c);
          (pvVar5->field_0).v[2] =
               auVar34._8_4_ *
               (fVar63 * local_3480.v[2] +
               fVar36 * fStack_3468 + fVar42 * fStack_3448 + fVar38 * fStack_3458) +
               auVar32._8_4_ *
               (fVar63 * fStack_3438 +
               fVar36 * (float)uStack_34e8 + fVar42 * fStack_3408 + fVar38 * fVar76) +
               auVar37._8_4_ *
               (fVar63 * fStack_33f8 + fVar36 * fVar61 + fVar42 * fStack_33c8 + fVar38 * fVar71) +
               auVar40._8_4_ *
               (fVar63 * fStack_33b8 +
               fVar36 * fStack_33a8 + fVar38 * fStack_3398 + fVar42 * fStack_3388);
          (pvVar5->field_0).v[3] =
               auVar34._12_4_ *
               (fVar64 * local_3480.v[3] +
               fVar68 * fStack_3464 + fVar44 * fStack_3444 + fVar41 * fStack_3454) +
               auVar32._12_4_ *
               (fVar64 * fStack_3434 +
               fVar68 * uStack_34e8._4_4_ + fVar44 * fStack_3404 + fVar41 * fVar77) +
               auVar37._12_4_ *
               (fVar64 * fStack_33f4 + fVar68 * fVar62 + fVar44 * fStack_33c4 + fVar41 * fVar73) +
               auVar40._12_4_ *
               (fVar64 * fStack_33b4 +
               fVar68 * fStack_33a4 + fVar41 * fStack_3394 + fVar44 * fStack_3384);
        }
        if (pvVar6 != (vfloat_impl<4> *)0x0) {
          auVar34 = vcmpps_avx(auVar28,SUB6416(ZEXT464(0x3f800000),0),0);
          auVar32 = vcmpps_avx(auVar28,ZEXT816(0) << 0x40,0);
          auVar34 = vorps_avx(auVar32,auVar34);
          if ((fVar29 == 1.0 || fVar29 == 0.0) ||
              (auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            fStack_34fc = fStack_33ec;
            local_3500 = local_33f0;
            fStack_34f8 = fStack_33e8;
            fStack_34f4 = fStack_33e4;
            fVar74 = local_3430;
            fVar75 = fStack_342c;
            fVar76 = fStack_3428;
            fVar77 = fStack_3424;
            fVar67 = local_3420;
            fVar69 = fStack_341c;
            fVar71 = fStack_3418;
            fVar73 = fStack_3414;
            fVar58 = local_33e0;
            fVar60 = fStack_33dc;
            fVar61 = fStack_33d8;
            fVar62 = fStack_33d4;
          }
          else {
            auVar37 = vshufps_avx(auVar28,auVar28,0);
            auVar40 = vshufps_avx(auVar30,auVar30,0);
            fVar74 = fVar27 + fVar29;
            auVar32 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
            auVar32 = ZEXT416((uint)(auVar32._0_4_ * (2.0 - auVar32._0_4_ * fVar74)));
            auVar59 = vshufps_avx(auVar32,auVar32,0);
            fVar74 = 1.0 - fVar27;
            auVar14 = vshufps_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),0);
            fVar74 = fVar74 + fVar29;
            auVar32 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
            auVar32 = ZEXT416((uint)(auVar32._0_4_ * (2.0 - fVar74 * auVar32._0_4_)));
            auVar33 = vshufps_avx(auVar32,auVar32,0);
            auVar15 = vshufps_avx(ZEXT416((uint)(1.0 - fVar29)),ZEXT416((uint)(1.0 - fVar29)),0);
            fVar74 = (2.0 - fVar27) - fVar29;
            auVar32 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
            auVar32 = ZEXT416((uint)(auVar32._0_4_ * (2.0 - fVar74 * auVar32._0_4_)));
            auVar16 = vshufps_avx(auVar32,auVar32,0);
            fVar74 = (fVar27 + 1.0) - fVar29;
            auVar32 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
            auVar32 = ZEXT416((uint)(auVar32._0_4_ * (2.0 - auVar32._0_4_ * fVar74)));
            auVar32 = vshufps_avx(auVar32,auVar32,0);
            fStack_34fc = (auVar15._4_4_ * fStack_33ec + auVar37._4_4_ * fStack_335c) *
                          auVar32._4_4_;
            local_3500 = (auVar15._0_4_ * local_33f0 + auVar37._0_4_ * local_3360) * auVar32._0_4_;
            fStack_34f8 = (auVar15._8_4_ * fStack_33e8 + auVar37._8_4_ * fStack_3358) *
                          auVar32._8_4_;
            fStack_34f4 = (auVar15._12_4_ * fStack_33e4 + auVar37._12_4_ * fStack_3354) *
                          auVar32._12_4_;
            fVar74 = (local_3430 * auVar37._0_4_ + auVar40._0_4_ * local_3380) * auVar59._0_4_;
            fVar75 = (fStack_342c * auVar37._4_4_ + auVar40._4_4_ * fStack_337c) * auVar59._4_4_;
            fVar76 = (fStack_3428 * auVar37._8_4_ + auVar40._8_4_ * fStack_3378) * auVar59._8_4_;
            fVar77 = (fStack_3424 * auVar37._12_4_ + auVar40._12_4_ * fStack_3374) * auVar59._12_4_;
            fVar67 = auVar33._0_4_ * (auVar14._0_4_ * local_3370 + local_3420 * auVar40._0_4_);
            fVar69 = auVar33._4_4_ * (auVar14._4_4_ * fStack_336c + fStack_341c * auVar40._4_4_);
            fVar71 = auVar33._8_4_ * (auVar14._8_4_ * fStack_3368 + fStack_3418 * auVar40._8_4_);
            fVar73 = auVar33._12_4_ * (auVar14._12_4_ * fStack_3364 + fStack_3414 * auVar40._12_4_);
            fVar58 = auVar16._0_4_ * (auVar15._0_4_ * local_3350 + auVar14._0_4_ * local_33e0);
            fVar60 = auVar16._4_4_ * (auVar15._4_4_ * fStack_334c + auVar14._4_4_ * fStack_33dc);
            fVar61 = auVar16._8_4_ * (auVar15._8_4_ * fStack_3348 + auVar14._8_4_ * fStack_33d8);
            fVar62 = auVar16._12_4_ * (auVar15._12_4_ * fStack_3344 + auVar14._12_4_ * fStack_33d4);
          }
          fVar70 = 1.0 - fVar27;
          fVar72 = 1.0 - fVar29;
          fVar31 = fVar70 * fVar70;
          fVar13 = fVar27 * fVar70 + fVar27 * fVar70;
          fVar35 = fVar27 * fVar27;
          fVar36 = fVar35 * 3.0;
          fVar68 = fVar72 * fVar72;
          auVar32 = ZEXT416((uint)((fVar13 - fVar35) * 3.0));
          auVar32 = vshufps_avx(auVar32,auVar32,0);
          auVar37 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
          fVar63 = auVar37._0_4_;
          fVar64 = auVar37._4_4_;
          fVar65 = auVar37._8_4_;
          fVar66 = auVar37._12_4_;
          fVar42 = auVar32._0_4_;
          fVar44 = auVar32._4_4_;
          fVar45 = auVar32._8_4_;
          fVar46 = auVar32._12_4_;
          auVar32 = ZEXT416((uint)((fVar31 - fVar13) * 3.0));
          auVar32 = vshufps_avx(auVar32,auVar32,0);
          fVar47 = auVar32._0_4_;
          fVar48 = auVar32._4_4_;
          fVar49 = auVar32._8_4_;
          fVar50 = auVar32._12_4_;
          auVar32 = vshufps_avx(ZEXT416((uint)(fVar31 * -3.0)),ZEXT416((uint)(fVar31 * -3.0)),0);
          fVar38 = auVar32._0_4_;
          fVar41 = auVar32._4_4_;
          fVar43 = auVar32._8_4_;
          fVar39 = auVar32._12_4_;
          auVar32 = vshufps_avx(ZEXT416((uint)(fVar72 * fVar68)),ZEXT416((uint)(fVar72 * fVar68)),0)
          ;
          fVar13 = fVar29 * fVar29;
          auVar37 = ZEXT416((uint)(fVar29 * 3.0 * fVar68));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          auVar40 = ZEXT416((uint)(fVar72 * fVar13 * 3.0));
          auVar40 = vshufps_avx(auVar40,auVar40,0);
          auVar59 = vshufps_avx(ZEXT416((uint)(fVar29 * fVar13)),ZEXT416((uint)(fVar29 * fVar13)),0)
          ;
          auVar14 = vpermilps_avx(local_34e0,0);
          (pvVar6->field_0).v[0] =
               auVar14._0_4_ *
               (auVar32._0_4_ *
                (fVar38 * local_3480.v[0] +
                fVar47 * local_3470 + fVar63 * local_3450 + fVar42 * local_3460) +
               auVar37._0_4_ *
               (fVar38 * local_3440 + fVar47 * fVar74 + fVar42 * fVar67 + fVar63 * local_3410) +
               auVar59._0_4_ *
               (fVar38 * local_33c0 +
               fVar47 * local_33b0 + fVar63 * local_3390 + fVar42 * local_33a0) +
               auVar40._0_4_ *
               (fVar38 * local_3400 + fVar47 * local_3500 + fVar42 * fVar58 + fVar63 * local_33d0));
          (pvVar6->field_0).v[1] =
               auVar14._4_4_ *
               (auVar32._4_4_ *
                (fVar41 * local_3480.v[1] +
                fVar48 * fStack_346c + fVar64 * fStack_344c + fVar44 * fStack_345c) +
               auVar37._4_4_ *
               (fVar41 * fStack_343c + fVar48 * fVar75 + fVar44 * fVar69 + fVar64 * fStack_340c) +
               auVar59._4_4_ *
               (fVar41 * fStack_33bc +
               fVar48 * fStack_33ac + fVar64 * fStack_338c + fVar44 * fStack_339c) +
               auVar40._4_4_ *
               (fVar41 * fStack_33fc + fVar48 * fStack_34fc + fVar44 * fVar60 + fVar64 * fStack_33cc
               ));
          (pvVar6->field_0).v[2] =
               auVar14._8_4_ *
               (auVar32._8_4_ *
                (fVar43 * local_3480.v[2] +
                fVar49 * fStack_3468 + fVar65 * fStack_3448 + fVar45 * fStack_3458) +
               auVar37._8_4_ *
               (fVar43 * fStack_3438 + fVar49 * fVar76 + fVar45 * fVar71 + fVar65 * fStack_3408) +
               auVar59._8_4_ *
               (fVar43 * fStack_33b8 +
               fVar49 * fStack_33a8 + fVar65 * fStack_3388 + fVar45 * fStack_3398) +
               auVar40._8_4_ *
               (fVar43 * fStack_33f8 + fVar49 * fStack_34f8 + fVar45 * fVar61 + fVar65 * fStack_33c8
               ));
          (pvVar6->field_0).v[3] =
               auVar14._12_4_ *
               (auVar32._12_4_ *
                (fVar39 * local_3480.v[3] +
                fVar50 * fStack_3464 + fVar66 * fStack_3444 + fVar46 * fStack_3454) +
               auVar37._12_4_ *
               (fVar39 * fStack_3434 + fVar50 * fVar77 + fVar46 * fVar73 + fVar66 * fStack_3404) +
               auVar59._12_4_ *
               (fVar39 * fStack_33b4 +
               fVar50 * fStack_33a4 + fVar66 * fStack_3384 + fVar46 * fStack_3394) +
               auVar40._12_4_ *
               (fVar39 * fStack_33f4 + fVar50 * fStack_34f4 + fVar46 * fVar62 + fVar66 * fStack_33c4
               ));
          fVar74 = local_3430;
          fVar75 = fStack_342c;
          fVar76 = fStack_3428;
          fVar77 = fStack_3424;
          fVar67 = local_3420;
          fVar69 = fStack_341c;
          fVar71 = fStack_3418;
          fVar73 = fStack_3414;
          fVar58 = local_33f0;
          fVar60 = fStack_33ec;
          fVar61 = fStack_33e8;
          fVar62 = fStack_33e4;
          fVar63 = local_33e0;
          fVar64 = fStack_33dc;
          fVar65 = fStack_33d8;
          fVar66 = fStack_33d4;
          if ((fVar29 != 1.0 && fVar29 != 0.0) &&
              (auVar34 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            auVar32 = vshufps_avx(auVar28,auVar28,0);
            auVar37 = vshufps_avx(auVar30,auVar30,0);
            fVar74 = fVar27 + fVar29;
            auVar34 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
            auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - fVar74 * auVar34._0_4_)));
            auVar34 = vshufps_avx(auVar34,auVar34,0);
            auVar40 = vshufps_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),0);
            fVar74 = (auVar32._0_4_ * local_3430 + auVar37._0_4_ * local_3380) * auVar34._0_4_;
            fVar75 = (auVar32._4_4_ * fStack_342c + auVar37._4_4_ * fStack_337c) * auVar34._4_4_;
            fVar76 = (auVar32._8_4_ * fStack_3428 + auVar37._8_4_ * fStack_3378) * auVar34._8_4_;
            fVar77 = (auVar32._12_4_ * fStack_3424 + auVar37._12_4_ * fStack_3374) * auVar34._12_4_;
            fVar67 = fVar70 + fVar29;
            auVar34 = vrcpss_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
            auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - fVar67 * auVar34._0_4_)));
            auVar34 = vshufps_avx(auVar34,auVar34,0);
            fVar67 = (local_3420 * auVar37._0_4_ + auVar40._0_4_ * local_3370) * auVar34._0_4_;
            fVar69 = (fStack_341c * auVar37._4_4_ + auVar40._4_4_ * fStack_336c) * auVar34._4_4_;
            fVar71 = (fStack_3418 * auVar37._8_4_ + auVar40._8_4_ * fStack_3368) * auVar34._8_4_;
            fVar73 = (fStack_3414 * auVar37._12_4_ + auVar40._12_4_ * fStack_3364) * auVar34._12_4_;
            auVar37 = vshufps_avx(ZEXT416((uint)fVar72),ZEXT416((uint)fVar72),0);
            fVar58 = (2.0 - fVar27) - fVar29;
            auVar34 = vrcpss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
            auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - fVar58 * auVar34._0_4_)));
            auVar34 = vshufps_avx(auVar34,auVar34,0);
            fVar63 = (auVar40._0_4_ * local_33e0 + auVar37._0_4_ * local_3350) * auVar34._0_4_;
            fVar64 = (auVar40._4_4_ * fStack_33dc + auVar37._4_4_ * fStack_334c) * auVar34._4_4_;
            fVar65 = (auVar40._8_4_ * fStack_33d8 + auVar37._8_4_ * fStack_3348) * auVar34._8_4_;
            fVar66 = (auVar40._12_4_ * fStack_33d4 + auVar37._12_4_ * fStack_3344) * auVar34._12_4_;
            fVar58 = (fVar27 + 1.0) - fVar29;
            auVar34 = vrcpss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
            auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - fVar58 * auVar34._0_4_)));
            auVar34 = vshufps_avx(auVar34,auVar34,0);
            fVar58 = (local_33f0 * auVar37._0_4_ + auVar32._0_4_ * local_3360) * auVar34._0_4_;
            fVar60 = (fStack_33ec * auVar37._4_4_ + auVar32._4_4_ * fStack_335c) * auVar34._4_4_;
            fVar61 = (fStack_33e8 * auVar37._8_4_ + auVar32._8_4_ * fStack_3358) * auVar34._8_4_;
            fVar62 = (fStack_33e4 * auVar37._12_4_ + auVar32._12_4_ * fStack_3354) * auVar34._12_4_;
          }
          fVar72 = fVar29 * fVar72 + fVar29 * fVar72;
          auVar34 = vshufps_avx(ZEXT416((uint)(fVar70 * fVar31)),ZEXT416((uint)(fVar70 * fVar31)),0)
          ;
          auVar32 = vshufps_avx(ZEXT416((uint)(fVar70 * fVar36)),ZEXT416((uint)(fVar70 * fVar36)),0)
          ;
          auVar37 = vshufps_avx(ZEXT416((uint)(fVar27 * fVar35)),ZEXT416((uint)(fVar27 * fVar35)),0)
          ;
          fVar47 = auVar37._0_4_;
          fVar48 = auVar37._4_4_;
          fVar49 = auVar37._8_4_;
          fVar50 = auVar37._12_4_;
          fVar38 = auVar32._0_4_;
          fVar41 = auVar32._4_4_;
          fVar43 = auVar32._8_4_;
          fVar39 = auVar32._12_4_;
          auVar32 = ZEXT416((uint)(fVar27 * 3.0 * fVar31));
          auVar32 = vshufps_avx(auVar32,auVar32,0);
          fVar42 = auVar32._0_4_;
          fVar44 = auVar32._4_4_;
          fVar45 = auVar32._8_4_;
          fVar46 = auVar32._12_4_;
          fVar31 = auVar34._0_4_;
          fVar35 = auVar34._4_4_;
          fVar36 = auVar34._8_4_;
          fVar70 = auVar34._12_4_;
          auVar34 = vshufps_avx(ZEXT416((uint)(fVar68 * -3.0)),ZEXT416((uint)(fVar68 * -3.0)),0);
          auVar32 = ZEXT416((uint)((fVar68 - fVar72) * 3.0));
          auVar32 = vshufps_avx(auVar32,auVar32,0);
          auVar37 = ZEXT416((uint)((fVar72 - fVar13) * 3.0));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          auVar40 = vpermilps_avx(ZEXT416((uint)(fVar13 * 3.0)),0);
          (pvVar7->field_0).v[0] =
               (auVar34._0_4_ *
                (fVar31 * local_3480.v[0] +
                fVar42 * local_3470 + fVar38 * local_3460 + fVar47 * local_3450) +
               auVar32._0_4_ *
               (fVar31 * local_3440 + fVar74 * fVar42 + fVar67 * fVar38 + fVar47 * local_3410) +
               (fVar31 * local_3400 + fVar58 * fVar42 + fVar63 * fVar38 + fVar47 * local_33d0) *
               auVar37._0_4_ +
               auVar40._0_4_ *
               (fVar31 * local_33c0 +
               fVar42 * local_33b0 + fVar47 * local_3390 + fVar38 * local_33a0)) * auVar14._0_4_;
          (pvVar7->field_0).v[1] =
               (auVar34._4_4_ *
                (fVar35 * local_3480.v[1] +
                fVar44 * fStack_346c + fVar41 * fStack_345c + fVar48 * fStack_344c) +
               auVar32._4_4_ *
               (fVar35 * fStack_343c + fVar75 * fVar44 + fVar69 * fVar41 + fVar48 * fStack_340c) +
               (fVar35 * fStack_33fc + fVar60 * fVar44 + fVar64 * fVar41 + fVar48 * fStack_33cc) *
               auVar37._4_4_ +
               auVar40._4_4_ *
               (fVar35 * fStack_33bc +
               fVar44 * fStack_33ac + fVar48 * fStack_338c + fVar41 * fStack_339c)) * auVar14._4_4_;
          (pvVar7->field_0).v[2] =
               (auVar34._8_4_ *
                (fVar36 * local_3480.v[2] +
                fVar45 * fStack_3468 + fVar43 * fStack_3458 + fVar49 * fStack_3448) +
               auVar32._8_4_ *
               (fVar36 * fStack_3438 + fVar76 * fVar45 + fVar71 * fVar43 + fVar49 * fStack_3408) +
               (fVar36 * fStack_33f8 + fVar61 * fVar45 + fVar65 * fVar43 + fVar49 * fStack_33c8) *
               auVar37._8_4_ +
               auVar40._8_4_ *
               (fVar36 * fStack_33b8 +
               fVar45 * fStack_33a8 + fVar49 * fStack_3388 + fVar43 * fStack_3398)) * auVar14._8_4_;
          (pvVar7->field_0).v[3] =
               (auVar34._12_4_ *
                (fVar70 * local_3480.v[3] +
                fVar46 * fStack_3464 + fVar39 * fStack_3454 + fVar50 * fStack_3444) +
               auVar32._12_4_ *
               (fVar70 * fStack_3434 + fVar77 * fVar46 + fVar73 * fVar39 + fVar50 * fStack_3404) +
               (fVar70 * fStack_33f4 + fVar62 * fVar46 + fVar66 * fVar39 + fVar50 * fStack_33c4) *
               auVar37._12_4_ +
               auVar40._12_4_ *
               (fVar70 * fStack_33b4 +
               fVar46 * fStack_33a4 + fVar50 * fStack_3384 + fVar39 * fStack_3394)) * auVar14._12_4_
          ;
        }
        if (pvVar8 == (vfloat_impl<4> *)0x0) {
          return;
        }
        auVar34 = vcmpps_avx(auVar28,SUB6416(ZEXT464(0x3f800000),0),0);
        auVar32 = vcmpps_avx(auVar28,ZEXT816(0) << 0x40,0);
        auVar34 = vorps_avx(auVar32,auVar34);
        bVar11 = fVar29 == 0.0;
        bVar12 = fVar29 == 1.0;
        if ((bVar12 || bVar11) || (auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_34f0._4_4_ = fStack_33ec;
          local_34f0._0_4_ = local_33f0;
          uStack_34e8._0_4_ = fStack_33e8;
          uStack_34e8._4_4_ = fStack_33e4;
          fVar74 = local_3430;
          fVar75 = fStack_342c;
          fVar76 = fStack_3428;
          fVar77 = fStack_3424;
          fVar67 = local_3420;
          fVar69 = fStack_341c;
          fVar71 = fStack_3418;
          fVar73 = fStack_3414;
          fVar58 = local_33e0;
          fVar60 = fStack_33dc;
          fVar61 = fStack_33d8;
          fVar62 = fStack_33d4;
        }
        else {
          auVar37 = vshufps_avx(auVar28,auVar28,0);
          auVar40 = vshufps_avx(auVar30,auVar30,0);
          fVar74 = fVar27 + fVar29;
          auVar32 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
          auVar32 = ZEXT416((uint)(auVar32._0_4_ * (2.0 - auVar32._0_4_ * fVar74)));
          auVar59 = vshufps_avx(auVar32,auVar32,0);
          fVar74 = 1.0 - fVar27;
          auVar14 = vshufps_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),0);
          fVar74 = fVar74 + fVar29;
          auVar32 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
          auVar32 = ZEXT416((uint)(auVar32._0_4_ * (2.0 - fVar74 * auVar32._0_4_)));
          auVar33 = vshufps_avx(auVar32,auVar32,0);
          auVar15 = vshufps_avx(ZEXT416((uint)(1.0 - fVar29)),ZEXT416((uint)(1.0 - fVar29)),0);
          fVar74 = (2.0 - fVar27) - fVar29;
          auVar32 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
          auVar32 = ZEXT416((uint)(auVar32._0_4_ * (2.0 - fVar74 * auVar32._0_4_)));
          auVar16 = vshufps_avx(auVar32,auVar32,0);
          fVar74 = (fVar27 + 1.0) - fVar29;
          auVar32 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
          auVar32 = ZEXT416((uint)(auVar32._0_4_ * (2.0 - fVar74 * auVar32._0_4_)));
          auVar32 = vshufps_avx(auVar32,auVar32,0);
          local_34f0._4_4_ =
               (auVar15._4_4_ * fStack_33ec + auVar37._4_4_ * fStack_335c) * auVar32._4_4_;
          local_34f0._0_4_ =
               (auVar15._0_4_ * local_33f0 + auVar37._0_4_ * local_3360) * auVar32._0_4_;
          uStack_34e8._0_4_ =
               (auVar15._8_4_ * fStack_33e8 + auVar37._8_4_ * fStack_3358) * auVar32._8_4_;
          uStack_34e8._4_4_ =
               (auVar15._12_4_ * fStack_33e4 + auVar37._12_4_ * fStack_3354) * auVar32._12_4_;
          fVar74 = (auVar40._0_4_ * local_3380 + local_3430 * auVar37._0_4_) * auVar59._0_4_;
          fVar75 = (auVar40._4_4_ * fStack_337c + fStack_342c * auVar37._4_4_) * auVar59._4_4_;
          fVar76 = (auVar40._8_4_ * fStack_3378 + fStack_3428 * auVar37._8_4_) * auVar59._8_4_;
          fVar77 = (auVar40._12_4_ * fStack_3374 + fStack_3424 * auVar37._12_4_) * auVar59._12_4_;
          fVar67 = auVar33._0_4_ * (auVar14._0_4_ * local_3370 + local_3420 * auVar40._0_4_);
          fVar69 = auVar33._4_4_ * (auVar14._4_4_ * fStack_336c + fStack_341c * auVar40._4_4_);
          fVar71 = auVar33._8_4_ * (auVar14._8_4_ * fStack_3368 + fStack_3418 * auVar40._8_4_);
          fVar73 = auVar33._12_4_ * (auVar14._12_4_ * fStack_3364 + fStack_3414 * auVar40._12_4_);
          fVar58 = auVar16._0_4_ * (auVar15._0_4_ * local_3350 + auVar14._0_4_ * local_33e0);
          fVar60 = auVar16._4_4_ * (auVar15._4_4_ * fStack_334c + auVar14._4_4_ * fStack_33dc);
          fVar61 = auVar16._8_4_ * (auVar15._8_4_ * fStack_3348 + auVar14._8_4_ * fStack_33d8);
          fVar62 = auVar16._12_4_ * (auVar15._12_4_ * fStack_3344 + auVar14._12_4_ * fStack_33d4);
        }
        fVar35 = 1.0 - fVar27;
        fVar36 = 1.0 - fVar29;
        auVar33 = ZEXT416((uint)fVar35);
        fVar13 = fVar36 * fVar36;
        auVar32 = vshufps_avx(ZEXT416((uint)(fVar36 * fVar13)),ZEXT416((uint)(fVar36 * fVar13)),0);
        auVar37 = ZEXT416((uint)((fVar35 - (fVar27 + fVar27)) * 6.0));
        auVar37 = vshufps_avx(auVar37,auVar37,0);
        auVar40 = vshufps_avx(ZEXT416((uint)(fVar27 * 6.0)),ZEXT416((uint)(fVar27 * 6.0)),0);
        fVar48 = auVar40._0_4_;
        fVar49 = auVar40._4_4_;
        fVar50 = auVar40._8_4_;
        fVar51 = auVar40._12_4_;
        fVar44 = auVar37._0_4_;
        fVar45 = auVar37._4_4_;
        fVar46 = auVar37._8_4_;
        fVar47 = auVar37._12_4_;
        auVar37 = ZEXT416((uint)((fVar27 - (fVar35 + fVar35)) * 6.0));
        auVar37 = vshufps_avx(auVar37,auVar37,0);
        fVar41 = auVar37._0_4_;
        fVar43 = auVar37._4_4_;
        fVar39 = auVar37._8_4_;
        fVar42 = auVar37._12_4_;
        auVar37 = vshufps_avx(ZEXT416((uint)(fVar35 * 6.0)),ZEXT416((uint)(fVar35 * 6.0)),0);
        fVar68 = auVar37._0_4_;
        fVar70 = auVar37._4_4_;
        fVar72 = auVar37._8_4_;
        fVar63 = auVar37._12_4_;
        fVar31 = fVar29 * fVar29;
        auVar37 = ZEXT416((uint)(fVar29 * 3.0 * fVar13));
        auVar37 = vshufps_avx(auVar37,auVar37,0);
        auVar40 = ZEXT416((uint)(fVar31 * 3.0 * fVar36));
        auVar40 = vshufps_avx(auVar40,auVar40,0);
        auVar59 = vshufps_avx(ZEXT416((uint)(fVar31 * fVar29)),ZEXT416((uint)(fVar31 * fVar29)),0);
        auVar14 = vshufps_avx(ZEXT416((uint)((float)local_34e0._0_4_ * (float)local_34e0._0_4_)),
                              ZEXT416((uint)((float)local_34e0._0_4_ * (float)local_34e0._0_4_)),0);
        fVar64 = auVar14._0_4_;
        fVar65 = auVar14._4_4_;
        fVar66 = auVar14._8_4_;
        fVar38 = auVar14._12_4_;
        (pvVar8->field_0).v[0] =
             fVar64 * (auVar32._0_4_ *
                       (fVar68 * local_3480.v[0] +
                       fVar41 * local_3470 + fVar48 * local_3450 + fVar44 * local_3460) +
                      auVar37._0_4_ *
                      (fVar68 * local_3440 + fVar74 * fVar41 + fVar44 * fVar67 + fVar48 * local_3410
                      ) + auVar40._0_4_ *
                          (fVar68 * local_3400 +
                          fVar41 * (float)local_34f0 + fVar48 * local_33d0 + fVar44 * fVar58) +
                          auVar59._0_4_ *
                          (fVar68 * local_33c0 +
                          fVar41 * local_33b0 + fVar44 * local_33a0 + fVar48 * local_3390));
        (pvVar8->field_0).v[1] =
             fVar65 * (auVar32._4_4_ *
                       (fVar70 * local_3480.v[1] +
                       fVar43 * fStack_346c + fVar49 * fStack_344c + fVar45 * fStack_345c) +
                      auVar37._4_4_ *
                      (fVar70 * fStack_343c +
                      fVar75 * fVar43 + fVar45 * fVar69 + fVar49 * fStack_340c) +
                      auVar40._4_4_ *
                      (fVar70 * fStack_33fc +
                      fVar43 * local_34f0._4_4_ + fVar49 * fStack_33cc + fVar45 * fVar60) +
                      auVar59._4_4_ *
                      (fVar70 * fStack_33bc +
                      fVar43 * fStack_33ac + fVar45 * fStack_339c + fVar49 * fStack_338c));
        (pvVar8->field_0).v[2] =
             fVar66 * (auVar32._8_4_ *
                       (fVar72 * local_3480.v[2] +
                       fVar39 * fStack_3468 + fVar50 * fStack_3448 + fVar46 * fStack_3458) +
                      auVar37._8_4_ *
                      (fVar72 * fStack_3438 +
                      fVar76 * fVar39 + fVar46 * fVar71 + fVar50 * fStack_3408) +
                      auVar40._8_4_ *
                      (fVar72 * fStack_33f8 +
                      fVar39 * (float)uStack_34e8 + fVar50 * fStack_33c8 + fVar46 * fVar61) +
                      auVar59._8_4_ *
                      (fVar72 * fStack_33b8 +
                      fVar39 * fStack_33a8 + fVar46 * fStack_3398 + fVar50 * fStack_3388));
        (pvVar8->field_0).v[3] =
             fVar38 * (auVar32._12_4_ *
                       (fVar63 * local_3480.v[3] +
                       fVar42 * fStack_3464 + fVar51 * fStack_3444 + fVar47 * fStack_3454) +
                      auVar37._12_4_ *
                      (fVar63 * fStack_3434 +
                      fVar77 * fVar42 + fVar47 * fVar73 + fVar51 * fStack_3404) +
                      auVar40._12_4_ *
                      (fVar63 * fStack_33f4 +
                      fVar42 * uStack_34e8._4_4_ + fVar51 * fStack_33c4 + fVar47 * fVar62) +
                      auVar59._12_4_ *
                      (fVar63 * fStack_33b4 +
                      fVar42 * fStack_33a4 + fVar47 * fStack_3394 + fVar51 * fStack_3384));
        auVar32 = ZEXT416((uint)fVar36);
        fVar74 = local_3430;
        fVar75 = fStack_342c;
        fVar76 = fStack_3428;
        fVar77 = fStack_3424;
        fVar67 = local_3420;
        fVar69 = fStack_341c;
        fVar71 = fStack_3418;
        fVar73 = fStack_3414;
        fVar58 = local_33f0;
        fVar60 = fStack_33ec;
        fVar61 = fStack_33e8;
        fVar62 = fStack_33e4;
        fVar68 = local_33e0;
        fVar70 = fStack_33dc;
        fVar72 = fStack_33d8;
        fVar63 = fStack_33d4;
        if ((!bVar12 && !bVar11) && (auVar34 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          auVar40 = vshufps_avx(auVar28,auVar28,0);
          auVar59 = vshufps_avx(auVar30,auVar30,0);
          fVar74 = fVar27 + fVar29;
          auVar37 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
          auVar37 = ZEXT416((uint)(auVar37._0_4_ * (2.0 - auVar37._0_4_ * fVar74)));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          auVar14 = vshufps_avx(auVar33,auVar33,0);
          fVar74 = auVar37._0_4_ * (auVar40._0_4_ * local_3430 + auVar59._0_4_ * local_3380);
          fVar75 = auVar37._4_4_ * (auVar40._4_4_ * fStack_342c + auVar59._4_4_ * fStack_337c);
          fVar76 = auVar37._8_4_ * (auVar40._8_4_ * fStack_3428 + auVar59._8_4_ * fStack_3378);
          fVar77 = auVar37._12_4_ * (auVar40._12_4_ * fStack_3424 + auVar59._12_4_ * fStack_3374);
          fVar67 = fVar35 + fVar29;
          auVar37 = vrcpss_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
          auVar37 = ZEXT416((uint)(auVar37._0_4_ * (2.0 - fVar67 * auVar37._0_4_)));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          fVar67 = auVar37._0_4_ * (auVar14._0_4_ * local_3370 + local_3420 * auVar59._0_4_);
          fVar69 = auVar37._4_4_ * (auVar14._4_4_ * fStack_336c + fStack_341c * auVar59._4_4_);
          fVar71 = auVar37._8_4_ * (auVar14._8_4_ * fStack_3368 + fStack_3418 * auVar59._8_4_);
          fVar73 = auVar37._12_4_ * (auVar14._12_4_ * fStack_3364 + fStack_3414 * auVar59._12_4_);
          auVar59 = vshufps_avx(auVar32,auVar32,0);
          fVar58 = (2.0 - fVar27) - fVar29;
          auVar37 = vrcpss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
          auVar37 = ZEXT416((uint)(auVar37._0_4_ * (2.0 - fVar58 * auVar37._0_4_)));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          fVar68 = auVar37._0_4_ * (auVar59._0_4_ * local_3350 + auVar14._0_4_ * local_33e0);
          fVar70 = auVar37._4_4_ * (auVar59._4_4_ * fStack_334c + auVar14._4_4_ * fStack_33dc);
          fVar72 = auVar37._8_4_ * (auVar59._8_4_ * fStack_3348 + auVar14._8_4_ * fStack_33d8);
          fVar63 = auVar37._12_4_ * (auVar59._12_4_ * fStack_3344 + auVar14._12_4_ * fStack_33d4);
          fVar58 = (fVar27 + 1.0) - fVar29;
          auVar37 = vrcpss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
          auVar37 = ZEXT416((uint)(auVar37._0_4_ * (2.0 - auVar37._0_4_ * fVar58)));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          fVar58 = (auVar59._0_4_ * local_33f0 + auVar40._0_4_ * local_3360) * auVar37._0_4_;
          fVar60 = (auVar59._4_4_ * fStack_33ec + auVar40._4_4_ * fStack_335c) * auVar37._4_4_;
          fVar61 = (auVar59._8_4_ * fStack_33e8 + auVar40._8_4_ * fStack_3358) * auVar37._8_4_;
          fVar62 = (auVar59._12_4_ * fStack_33e4 + auVar40._12_4_ * fStack_3354) * auVar37._12_4_;
        }
        fVar41 = fVar35 * fVar35;
        fVar43 = fVar27 * fVar27;
        auVar37 = ZEXT416((uint)(fVar35 * fVar43 * 3.0));
        auVar37 = vshufps_avx(auVar37,auVar37,0);
        auVar40 = vshufps_avx(ZEXT416((uint)(fVar43 * fVar27)),ZEXT416((uint)(fVar43 * fVar27)),0);
        fVar46 = auVar40._0_4_;
        fVar47 = auVar40._4_4_;
        fVar48 = auVar40._8_4_;
        fVar49 = auVar40._12_4_;
        fVar39 = auVar37._0_4_;
        fVar42 = auVar37._4_4_;
        fVar44 = auVar37._8_4_;
        fVar45 = auVar37._12_4_;
        auVar37 = ZEXT416((uint)(fVar41 * fVar27 * 3.0));
        auVar37 = vshufps_avx(auVar37,auVar37,0);
        fVar50 = auVar37._0_4_;
        fVar51 = auVar37._4_4_;
        fVar52 = auVar37._8_4_;
        fVar53 = auVar37._12_4_;
        auVar37 = vshufps_avx(ZEXT416((uint)(fVar41 * fVar35)),ZEXT416((uint)(fVar41 * fVar35)),0);
        fVar54 = auVar37._0_4_;
        fVar55 = auVar37._4_4_;
        fVar56 = auVar37._8_4_;
        fVar57 = auVar37._12_4_;
        auVar37 = vshufps_avx(ZEXT416((uint)(fVar36 * 6.0)),ZEXT416((uint)(fVar36 * 6.0)),0);
        auVar40 = ZEXT416((uint)((fVar29 - (fVar36 + fVar36)) * 6.0));
        auVar40 = vshufps_avx(auVar40,auVar40,0);
        auVar59 = ZEXT416((uint)((fVar36 - (fVar29 + fVar29)) * 6.0));
        auVar59 = vshufps_avx(auVar59,auVar59,0);
        auVar14 = vshufps_avx(ZEXT416((uint)(fVar29 * 6.0)),ZEXT416((uint)(fVar29 * 6.0)),0);
        (pvVar9->field_0).v[0] =
             (auVar37._0_4_ *
              (fVar54 * local_3480.v[0] +
              fVar50 * local_3470 + fVar46 * local_3450 + fVar39 * local_3460) +
             auVar40._0_4_ *
             (fVar54 * local_3440 + fVar67 * fVar39 + fVar46 * local_3410 + fVar50 * fVar74) +
             auVar59._0_4_ *
             (fVar54 * local_3400 + fVar50 * fVar58 + fVar68 * fVar39 + fVar46 * local_33d0) +
             auVar14._0_4_ *
             (fVar54 * local_33c0 + fVar50 * local_33b0 + fVar46 * local_3390 + fVar39 * local_33a0)
             ) * fVar64;
        (pvVar9->field_0).v[1] =
             (auVar37._4_4_ *
              (fVar55 * local_3480.v[1] +
              fVar51 * fStack_346c + fVar47 * fStack_344c + fVar42 * fStack_345c) +
             auVar40._4_4_ *
             (fVar55 * fStack_343c + fVar69 * fVar42 + fVar47 * fStack_340c + fVar51 * fVar75) +
             auVar59._4_4_ *
             (fVar55 * fStack_33fc + fVar51 * fVar60 + fVar70 * fVar42 + fVar47 * fStack_33cc) +
             auVar14._4_4_ *
             (fVar55 * fStack_33bc +
             fVar51 * fStack_33ac + fVar47 * fStack_338c + fVar42 * fStack_339c)) * fVar65;
        (pvVar9->field_0).v[2] =
             (auVar37._8_4_ *
              (fVar56 * local_3480.v[2] +
              fVar52 * fStack_3468 + fVar48 * fStack_3448 + fVar44 * fStack_3458) +
             auVar40._8_4_ *
             (fVar56 * fStack_3438 + fVar71 * fVar44 + fVar48 * fStack_3408 + fVar52 * fVar76) +
             auVar59._8_4_ *
             (fVar56 * fStack_33f8 + fVar52 * fVar61 + fVar72 * fVar44 + fVar48 * fStack_33c8) +
             auVar14._8_4_ *
             (fVar56 * fStack_33b8 +
             fVar52 * fStack_33a8 + fVar48 * fStack_3388 + fVar44 * fStack_3398)) * fVar66;
        (pvVar9->field_0).v[3] =
             (auVar37._12_4_ *
              (fVar57 * local_3480.v[3] +
              fVar53 * fStack_3464 + fVar49 * fStack_3444 + fVar45 * fStack_3454) +
             auVar40._12_4_ *
             (fVar57 * fStack_3434 + fVar73 * fVar45 + fVar49 * fStack_3404 + fVar53 * fVar77) +
             auVar59._12_4_ *
             (fVar57 * fStack_33f4 + fVar53 * fVar62 + fVar63 * fVar45 + fVar49 * fStack_33c4) +
             auVar14._12_4_ *
             (fVar57 * fStack_33b4 +
             fVar53 * fStack_33a4 + fVar49 * fStack_3384 + fVar45 * fStack_3394)) * fVar38;
        if ((!bVar12 && !bVar11) && (auVar34 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          auVar28 = vshufps_avx(auVar28,auVar28,0);
          auVar34 = vshufps_avx(auVar30,auVar30,0);
          fVar74 = fVar27 + fVar29;
          auVar30 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
          auVar30 = ZEXT416((uint)(auVar30._0_4_ * (2.0 - auVar30._0_4_ * fVar74)));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          auVar37 = vshufps_avx(auVar33,auVar33,0);
          local_3430 = (local_3430 * auVar28._0_4_ + auVar34._0_4_ * local_3380) * auVar30._0_4_;
          fStack_342c = (fStack_342c * auVar28._4_4_ + auVar34._4_4_ * fStack_337c) * auVar30._4_4_;
          fStack_3428 = (fStack_3428 * auVar28._8_4_ + auVar34._8_4_ * fStack_3378) * auVar30._8_4_;
          fStack_3424 = (fStack_3424 * auVar28._12_4_ + auVar34._12_4_ * fStack_3374) *
                        auVar30._12_4_;
          fVar74 = fVar35 + fVar29;
          auVar30 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
          auVar30 = ZEXT416((uint)(auVar30._0_4_ * (2.0 - fVar74 * auVar30._0_4_)));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          local_3420 = auVar30._0_4_ * (auVar37._0_4_ * local_3370 + local_3420 * auVar34._0_4_);
          fStack_341c = auVar30._4_4_ * (auVar37._4_4_ * fStack_336c + fStack_341c * auVar34._4_4_);
          fStack_3418 = auVar30._8_4_ * (auVar37._8_4_ * fStack_3368 + fStack_3418 * auVar34._8_4_);
          fStack_3414 = auVar30._12_4_ *
                        (auVar37._12_4_ * fStack_3364 + fStack_3414 * auVar34._12_4_);
          auVar34 = vshufps_avx(auVar32,auVar32,0);
          fVar74 = (2.0 - fVar27) - fVar29;
          auVar30 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
          auVar30 = ZEXT416((uint)(auVar30._0_4_ * (2.0 - fVar74 * auVar30._0_4_)));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          local_33e0 = auVar30._0_4_ * (auVar34._0_4_ * local_3350 + auVar37._0_4_ * local_33e0);
          fStack_33dc = auVar30._4_4_ * (auVar34._4_4_ * fStack_334c + auVar37._4_4_ * fStack_33dc);
          fStack_33d8 = auVar30._8_4_ * (auVar34._8_4_ * fStack_3348 + auVar37._8_4_ * fStack_33d8);
          fStack_33d4 = auVar30._12_4_ *
                        (auVar34._12_4_ * fStack_3344 + auVar37._12_4_ * fStack_33d4);
          fVar74 = (fVar27 + 1.0) - fVar29;
          auVar30 = vrcpss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
          auVar30 = ZEXT416((uint)(auVar30._0_4_ * (2.0 - auVar30._0_4_ * fVar74)));
          auVar30 = vshufps_avx(auVar30,auVar30,0);
          local_33f0 = (local_33f0 * auVar34._0_4_ + auVar28._0_4_ * local_3360) * auVar30._0_4_;
          fStack_33ec = (fStack_33ec * auVar34._4_4_ + auVar28._4_4_ * fStack_335c) * auVar30._4_4_;
          fStack_33e8 = (fStack_33e8 * auVar34._8_4_ + auVar28._8_4_ * fStack_3358) * auVar30._8_4_;
          fStack_33e4 = (fStack_33e4 * auVar34._12_4_ + auVar28._12_4_ * fStack_3354) *
                        auVar30._12_4_;
        }
        fVar27 = fVar27 * fVar35 + fVar27 * fVar35;
        fVar29 = fVar29 * fVar36 + fVar29 * fVar36;
        auVar30 = vshufps_avx(ZEXT416((uint)(fVar13 * -3.0)),ZEXT416((uint)(fVar13 * -3.0)),0);
        auVar28 = vshufps_avx(ZEXT416((uint)(fVar41 * -3.0)),ZEXT416((uint)(fVar41 * -3.0)),0);
        auVar34 = ZEXT416((uint)((fVar41 - fVar27) * 3.0));
        auVar34 = vshufps_avx(auVar34,auVar34,0);
        auVar32 = ZEXT416((uint)((fVar27 - fVar43) * 3.0));
        auVar32 = vshufps_avx(auVar32,auVar32,0);
        auVar37 = vpermilps_avx(ZEXT416((uint)(fVar43 * 3.0)),0);
        fVar62 = auVar37._0_4_;
        fVar35 = auVar37._4_4_;
        fVar36 = auVar37._8_4_;
        fVar68 = auVar37._12_4_;
        fVar73 = auVar32._0_4_;
        fVar58 = auVar32._4_4_;
        fVar60 = auVar32._8_4_;
        fVar61 = auVar32._12_4_;
        fVar77 = auVar34._0_4_;
        fVar67 = auVar34._4_4_;
        fVar69 = auVar34._8_4_;
        fVar71 = auVar34._12_4_;
        fVar27 = auVar28._0_4_;
        fVar74 = auVar28._4_4_;
        fVar75 = auVar28._8_4_;
        fVar76 = auVar28._12_4_;
        auVar28 = ZEXT416((uint)((fVar13 - fVar29) * 3.0));
        auVar28 = vshufps_avx(auVar28,auVar28,0);
        auVar34 = ZEXT416((uint)((fVar29 - fVar31) * 3.0));
        auVar34 = vshufps_avx(auVar34,auVar34,0);
        auVar32 = vpermilps_avx(ZEXT416((uint)(fVar31 * 3.0)),0);
        (pvVar10->field_0).v[0] =
             (auVar30._0_4_ *
              (fVar27 * local_3480.v[0] +
              fVar77 * local_3470 + fVar73 * local_3460 + fVar62 * local_3450) +
             auVar28._0_4_ *
             (fVar27 * local_3440 + local_3430 * fVar77 + local_3420 * fVar73 + fVar62 * local_3410)
             + auVar34._0_4_ *
               (fVar27 * local_3400 +
               local_33f0 * fVar77 + fVar62 * local_33d0 + fVar73 * local_33e0) +
               auVar32._0_4_ *
               (fVar27 * local_33c0 +
               fVar77 * local_33b0 + fVar62 * local_3390 + fVar73 * local_33a0)) * fVar64;
        (pvVar10->field_0).v[1] =
             (auVar30._4_4_ *
              (fVar74 * local_3480.v[1] +
              fVar67 * fStack_346c + fVar58 * fStack_345c + fVar35 * fStack_344c) +
             auVar28._4_4_ *
             (fVar74 * fStack_343c +
             fStack_342c * fVar67 + fStack_341c * fVar58 + fVar35 * fStack_340c) +
             auVar34._4_4_ *
             (fVar74 * fStack_33fc +
             fStack_33ec * fVar67 + fVar35 * fStack_33cc + fVar58 * fStack_33dc) +
             auVar32._4_4_ *
             (fVar74 * fStack_33bc +
             fVar67 * fStack_33ac + fVar35 * fStack_338c + fVar58 * fStack_339c)) * fVar65;
        (pvVar10->field_0).v[2] =
             (auVar30._8_4_ *
              (fVar75 * local_3480.v[2] +
              fVar69 * fStack_3468 + fVar60 * fStack_3458 + fVar36 * fStack_3448) +
             auVar28._8_4_ *
             (fVar75 * fStack_3438 +
             fStack_3428 * fVar69 + fStack_3418 * fVar60 + fVar36 * fStack_3408) +
             auVar34._8_4_ *
             (fVar75 * fStack_33f8 +
             fStack_33e8 * fVar69 + fVar36 * fStack_33c8 + fVar60 * fStack_33d8) +
             auVar32._8_4_ *
             (fVar75 * fStack_33b8 +
             fVar69 * fStack_33a8 + fVar36 * fStack_3388 + fVar60 * fStack_3398)) * fVar66;
        (pvVar10->field_0).v[3] =
             (auVar30._12_4_ *
              (fVar76 * local_3480.v[3] +
              fVar71 * fStack_3464 + fVar61 * fStack_3454 + fVar68 * fStack_3444) +
             auVar28._12_4_ *
             (fVar76 * fStack_3434 +
             fStack_3424 * fVar71 + fStack_3414 * fVar61 + fVar68 * fStack_3404) +
             auVar34._12_4_ *
             (fVar76 * fStack_33f4 +
             fStack_33e4 * fVar71 + fVar68 * fStack_33c4 + fVar61 * fStack_33d4) +
             auVar32._12_4_ *
             (fVar76 * fStack_33b4 +
             fVar71 * fStack_33a4 + fVar68 * fStack_3384 + fVar61 * fStack_3394)) * fVar38;
        return;
      }
LAB_00e96d78:
      BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init
                ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                 (EVP_PKEY_CTX *)patch);
      BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
                ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                 (uv->field_0).field_0.x,(uv->field_0).field_0.y,this->P,this->dPdu,this->dPdv,
                 this->ddPdudu,this->ddPdvdv,this->ddPdudv,(float)local_34e0._0_4_);
      return;
    }
    if ((bool)(bVar18 & bVar19 & bVar17 & bVar11)) goto LAB_00e96d78;
    array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
    array_t((array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
             *)&local_3480);
    CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::subdivide
              (patch,(array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                      *)&local_3480);
    aVar1 = (uv->field_0).field_0;
    auVar30._8_8_ = 0;
    auVar30._0_4_ = aVar1.x;
    auVar30._4_4_ = aVar1.y;
    auVar30 = vmovshdup_avx(auVar30);
    fVar27 = auVar30._0_4_;
    fVar29 = aVar1.x;
    fStack_34cc = aVar1.y;
    if (0.5 <= fVar27) {
      if (fVar29 <= 0.5) {
        array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
        operator=(&patch->ring,&local_d80);
        fVar29 = fVar29 + fVar29;
        fVar27 = fVar27 + fVar27 + -1.0;
        goto LAB_00e95cc0;
      }
      array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
      operator=(&patch->ring,&local_1a80);
      auVar28._0_4_ = fVar29 + fVar29 + -1.0;
      auVar28._4_4_ = fStack_34cc + fStack_34cc + -1.0;
      auVar28._8_4_ = 0xbf800000;
      auVar28._12_4_ = 0xbf800000;
    }
    else if (0.5 <= fVar29) {
      array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
      operator=(&patch->ring,&local_2780);
      fVar29 = fVar29 + fVar29 + -1.0;
      fVar27 = fVar27 + fVar27;
LAB_00e95cc0:
      auVar28 = vinsertps_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar27),0x10);
    }
    else {
      array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
      operator=(&patch->ring,
                (array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                 *)&local_3480);
      auVar28._0_4_ = fVar29 + fVar29;
      auVar28._4_4_ = fStack_34cc + fStack_34cc;
      auVar28._8_8_ = 0;
    }
    aVar2 = (anon_union_8_2_4062524c_for_Vec2<float>_1)vmovlps_avx(auVar28);
    uv->field_0 = aVar2;
    local_34e0 = ZEXT416((uint)((float)local_34e0._0_4_ + (float)local_34e0._0_4_));
    local_34f0 = local_34f0 + 1;
    array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
    ~array_t((array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
              *)&local_3480);
  } while( true );
}

Assistant:

void eval(CatmullClarkPatch& patch, Vec2f uv, float dscale, size_t depth, 
                  BezierCurve* border0 = nullptr, BezierCurve* border1 = nullptr, BezierCurve* border2 = nullptr, BezierCurve* border3 = nullptr)
        {
          while (true) 
          {
            typename CatmullClarkPatch::Type ty = patch.type();

            if (unlikely(final(patch,ty,depth)))
            {
              if (ty & CatmullClarkRing::TYPE_REGULAR) { 
                RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(234423,c,c,-1);
                return;
              } else {
                IrregularFillPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(34534,c,-1,c);
                return;
              }
            }
            else if (ty & CatmullClarkRing::TYPE_REGULAR_CREASES) { 
              assert(depth > 0); 
              RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(43524,c,c,-1);
              return;
            }
#if PATCH_USE_GREGORY == 2
            else if (ty & CatmullClarkRing::TYPE_GREGORY_CREASES) { 
              assert(depth > 0); 
              GregoryPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(23498,c,-1,c);
              return;
            }
#endif
            else
            {
              array_t<CatmullClarkPatch,4> patches; 
              patch.subdivide(patches); // FIXME: only have to generate one of the patches
              
              const float u = uv.x, v = uv.y;
              if (v < 0.5f) {
                if (u < 0.5f) { patch = patches[0]; uv = Vec2f(2.0f*u,2.0f*v); dscale *= 2.0f; }
                else          { patch = patches[1]; uv = Vec2f(2.0f*u-1.0f,2.0f*v); dscale *= 2.0f; }
              } else {
                if (u > 0.5f) { patch = patches[2]; uv = Vec2f(2.0f*u-1.0f,2.0f*v-1.0f); dscale *= 2.0f; }
                else          { patch = patches[3]; uv = Vec2f(2.0f*u,2.0f*v-1.0f); dscale *= 2.0f; }
              }
              depth++;
            }
          }